

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O0

int checkscript(void)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int local_c0;
  __pid_t local_bc;
  int w;
  int pid;
  stat s;
  char *prog [2];
  int local_c;
  
  iVar1 = stat("check",(stat *)&w);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == error_noent) {
      local_c = 1;
    }
    else {
      outs2("warning: ");
      outs2("unable to stat ");
      outs2(*service);
      outs2("/check: ");
      piVar2 = __errno_location();
      pcVar3 = error_str(*piVar2);
      outs2(pcVar3);
      flush2("\n");
      local_c = 0;
    }
  }
  else {
    local_bc = fork();
    if (local_bc == -1) {
      outs2("warning: ");
      outs2("unable to fork for ");
      outs2(*service);
      outs2("/check: ");
      piVar2 = __errno_location();
      pcVar3 = error_str(*piVar2);
      outs2(pcVar3);
      flush2("\n");
      local_c = 0;
    }
    else {
      if (local_bc == 0) {
        s.__glibc_reserved[2] = (__syscall_slong_t)anon_var_dwarf_348;
        close(1);
        execve("check",(char **)(s.__glibc_reserved + 2),_environ);
        outs2("warning: ");
        outs2("unable to run ");
        outs2(*service);
        outs2("/check: ");
        piVar2 = __errno_location();
        pcVar3 = error_str(*piVar2);
        outs2(pcVar3);
        flush2("\n");
        _exit(0);
      }
      do {
        iVar1 = wait_pid(&local_c0,local_bc);
        if (iVar1 != -1) {
          return (uint)((local_c0 >> 8 != 0 ^ 0xffU) & 1);
        }
        piVar2 = __errno_location();
      } while (*piVar2 == error_intr);
      outs2("warning: ");
      outs2("unable to wait for child ");
      outs2(*service);
      outs2("/check: ");
      piVar2 = __errno_location();
      pcVar3 = error_str(*piVar2);
      outs2(pcVar3);
      flush2("\n");
      local_c = 0;
    }
  }
  return local_c;
}

Assistant:

int checkscript() {
  char *prog[2];
  struct stat s;
  int pid, w;

  if (stat("check", &s) == -1) {
    if (errno == error_noent) return(1);
    outs2(WARN); outs2("unable to stat "); outs2(*service); outs2("/check: ");
    outs2(error_str(errno)); flush2("\n");
    return(0);
  }
  /* if (!(s.st_mode & S_IXUSR)) return(1); */
  if ((pid =fork()) == -1) {
    outs2(WARN); outs2("unable to fork for "); outs2(*service);
    outs2("/check: "); outs2(error_str(errno)); flush2("\n");
    return(0);
  }
  if (!pid) {
    prog[0] ="./check";
    prog[1] =0;
    close(1);
    execve("check", prog, environ);
    outs2(WARN); outs2("unable to run "); outs2(*service); outs2("/check: ");
    outs2(error_str(errno)); flush2("\n");
    _exit(0);
  }
  while (wait_pid(&w, pid) == -1) {
    if (errno == error_intr) continue;
    outs2(WARN); outs2("unable to wait for child "); outs2(*service);
    outs2("/check: "); outs2(error_str(errno)); flush2("\n");
    return(0);
  }
  return(!wait_exitcode(w));
}